

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O0

void __thiscall
r_exec::AutoFocusController::inject_input(AutoFocusController *this,View *input,uint64_t start)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppGVar5;
  View *this_00;
  long lVar6;
  Atom *this_01;
  _Mem *this_02;
  float fVar7;
  Atom local_50 [16];
  View *local_40;
  View *view;
  Group *output_group;
  Group *pGStack_28;
  uint16_t i;
  Group *origin;
  uint64_t start_local;
  View *input_local;
  AutoFocusController *this_local;
  
  origin = (Group *)start;
  start_local = (uint64_t)input;
  input_local = (View *)this;
  pGStack_28 = View::get_host(input);
  output_group._6_2_ = (ushort)origin;
  while( true ) {
    uVar3 = (ulong)output_group._6_2_;
    sVar4 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::size
                      (&this->output_groups);
    if (sVar4 <= uVar3) break;
    ppGVar5 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::operator[]
                        (&this->output_groups,(ulong)output_group._6_2_);
    view = (View *)*ppGVar5;
    this_00 = (View *)operator_new(0x100);
    View::View(this_00,(View *)start_local,true);
    (this_00->super_View).references[0] = (Code *)view;
    local_40 = this_00;
    r_code::View::code((View *)this_00,4);
    fVar7 = (float)r_code::Atom::asFloat();
    uVar1 = Group::get_upr(pGStack_28);
    uVar2 = Group::get_upr((Group *)view);
    lVar6 = r_code::Utils::GetGroupResilience((double)fVar7,(double)uVar1,(double)uVar2);
    r_code::Atom::Float((float)lVar6);
    this_01 = r_code::View::code(&local_40->super_View,4);
    r_code::Atom::operator=(this_01,local_50);
    r_code::Atom::~Atom(local_50);
    this_02 = _Mem::Get();
    _Mem::inject(this_02,local_40);
    output_group._6_2_ = output_group._6_2_ + 1;
  }
  return;
}

Assistant:

inline void AutoFocusController::inject_input(View *input, uint64_t start)
{
    Group *origin = input->get_host();

    for (uint16_t i = start; i < output_groups.size(); ++i) {
        Group *output_group = output_groups[i];
        View *view = new View(input, true);
        view->references[0] = output_group;
        view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
        _Mem::Get()->inject(view);
    }
}